

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatements
          (cmNinjaTargetGenerator *this,string *config,string *fileConfig,bool firstForConfig)

{
  _Rb_tree_node_base *lang;
  cmOSXBundleGenerator *pcVar1;
  cmMakefile *pcVar2;
  cmCustomCommand *pcVar3;
  cmGeneratorTarget *pcVar4;
  _Base_ptr p_Var5;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  pointer pbVar6;
  pointer pbVar7;
  pointer ppcVar8;
  pointer ppcVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  TargetType targetType;
  PolicyStatus PVar14;
  cmGeneratedFileStream *pcVar15;
  ostream *poVar16;
  string *psVar17;
  mapped_type *pmVar18;
  cmValue suffix;
  cmGlobalNinjaGenerator *pcVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar21;
  cmSourceFile *pcVar22;
  cmFileSet *pcVar23;
  MapToNinjaPathImpl MVar24;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var25;
  string *psVar26;
  string *psVar27;
  size_type sVar28;
  vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
  *this_00;
  _Base_ptr p_Var29;
  pointer ppcVar30;
  cmCustomCommand *pcVar31;
  cmNinjaTargetGenerator *pcVar32;
  string *l;
  value_type *__x;
  long lVar33;
  iterator __position;
  pointer ppcVar34;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  undefined8 uVar35;
  _Manager_type in_stack_fffffffffffffba8;
  char local_441;
  cmNinjaTargetGenerator *local_440;
  string *local_438;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *local_430;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> swiftSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts_private;
  cmSourceFile *sf;
  vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommandSources;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_338 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_2d8 [24];
  pointer local_2c0;
  const_iterator local_2b8;
  cmCustomCommand *cc;
  cmCustomCommand *pcStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_1d8 [120];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  const_iterator local_158;
  _Any_data local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  cmGeneratorTarget::CheckCxxModuleStatus
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  pcVar15 = GetImplFileStream(this,fileConfig);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar15);
  local_438 = fileConfig;
  pcVar15 = GetImplFileStream(this,fileConfig);
  poVar16 = std::operator<<((ostream *)pcVar15,"# Object build statements for ");
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  psVar17 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  poVar16 = std::operator<<(poVar16,(string *)psVar17);
  poVar16 = std::operator<<(poVar16," target ");
  GetTargetName_abi_cxx11_((string *)&customCommandSources,this);
  poVar16 = std::operator<<(poVar16,(string *)&customCommandSources);
  std::operator<<(poVar16,"\n\n");
  std::__cxx11::string::~string((string *)&customCommandSources);
  customCommands.
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommandSources,config);
  ppcVar9 = customCommandSources.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar34 = customCommandSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar34 != ppcVar9;
      ppcVar34 = ppcVar34 + 1) {
    cc = cmSourceFile::GetCustomCommand(*ppcVar34);
    cmLocalNinjaGenerator::AddCustomCommandTarget
              (this->LocalGenerator,cc,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::push_back
              (&customCommands,&cc);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommandSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommandSources,config);
  pcVar1 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  local_430 = &this->Configs;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_430,local_438);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar1,&customCommandSources,
             &((pmVar18->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType,config);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommandSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommandSources.
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommandSources,config);
  pcVar1 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_430,local_438);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar1,&customCommandSources,
             &((pmVar18->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType,config);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommandSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  local_440 = this;
  if (firstForConfig) {
    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&customCommandSources,"CMAKE_PCH_EXTENSION",(allocator<char> *)&cc);
    suffix = cmMakefile::GetDefinition(pcVar2,(string *)&customCommandSources);
    std::__cxx11::string::~string((string *)&customCommandSources);
    cc = (cmCustomCommand *)0x0;
    pcStack_210 = (cmCustomCommand *)0x0;
    local_208._M_allocated_capacity = 0;
    cmGeneratorTarget::GetExternalObjects
              ((this->super_cmCommonTargetGenerator).GeneratorTarget,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc,config);
    pcVar3 = pcStack_210;
    for (pcVar31 = cc; pcVar31 != pcVar3;
        pcVar31 = (cmCustomCommand *)
                  &(pcVar31->Outputs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar22 = (cmSourceFile *)
                (pcVar31->Outputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar19 = GetGlobalGenerator(local_440);
      psVar17 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar22);
      psVar17 = ConvertToNinjaPath(local_440,psVar17);
      (*(pcVar19->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x18])((value_type *)&customCommandSources,pcVar19,psVar17,config);
      str._M_str = (char *)customCommandSources.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
      str._M_len = (size_t)customCommandSources.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      bVar11 = cmHasSuffix(str,suffix);
      if (!bVar11) {
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                  ::operator[](local_430,config);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar18->Objects,(value_type *)&customCommandSources);
      }
      std::__cxx11::string::~string((string *)&customCommandSources);
    }
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc);
  }
  pcVar32 = local_440;
  pcVar19 = GetGlobalGenerator(local_440);
  bVar11 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar19);
  if (!bVar11) {
    GetObjectFileDir((string *)&customCommandSources,pcVar32,config);
    EnsureDirectoryExists(pcVar32,(string *)&customCommandSources);
    std::__cxx11::string::~string((string *)&customCommandSources);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"phony",(allocator<char> *)&customCommandSources);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&cc,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  GetTargetName_abi_cxx11_((string *)&swiftSources,pcVar32);
  cmStrCat<char_const(&)[29],std::__cxx11::string>
            ((string *)&customCommandSources,(char (*) [29])"Order-only phony target for ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&swiftSources);
  std::__cxx11::string::operator=((string *)&cc,(string *)&customCommandSources);
  std::__cxx11::string::~string((string *)&customCommandSources);
  std::__cxx11::string::~string((string *)&swiftSources);
  OrderDependsTargetForTarget((string *)&customCommandSources,pcVar32,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &customCommandSources);
  std::__cxx11::string::~string((string *)&customCommandSources);
  ccouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ccouts_private.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ccouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ccouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ccouts_private.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ccouts_private.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar11 = cmTarget::HasFileSets(((pcVar32->super_cmCommonTargetGenerator).GeneratorTarget)->Target)
  ;
  if (bVar11) {
    PVar14 = cmGeneratorTarget::GetPolicyStatusCMP0154
                       ((pcVar32->super_cmCommonTargetGenerator).GeneratorTarget);
    bVar11 = PVar14 - NEW < 3;
  }
  else {
    bVar11 = false;
  }
  ppcVar8 = customCommands.
            super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar30 = customCommands.
                  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; pcVar32 = local_440,
      ppcVar30 != ppcVar8; ppcVar30 = ppcVar30 + 1) {
    pcVar3 = *ppcVar30;
    uVar35 = 0x366784;
    std::__cxx11::string::string((string *)&local_70,(string *)config);
    local_d8._M_engaged = false;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    computeInternalDepfile.super__Function_base._M_functor._8_8_ = uVar35;
    computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_f8;
    computeInternalDepfile.super__Function_base._M_manager = in_stack_fffffffffffffba8;
    computeInternalDepfile._M_invoker = (_Invoker_type)config;
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)&customCommandSources,pcVar3,&local_70,
               (cmLocalGenerator *)local_440->LocalGenerator,true,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8,computeInternalDepfile);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_d8);
    std::__cxx11::string::~string((string *)&local_70);
    pvVar20 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                        ((cmCustomCommandGenerator *)&customCommandSources);
    pvVar21 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                        ((cmCustomCommandGenerator *)&customCommandSources);
    lVar33 = (long)ccouts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)ccouts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ccouts,
               (const_iterator)
               ccouts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (pvVar20->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (pvVar20->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ccouts,
               (const_iterator)
               ccouts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (pvVar21->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (pvVar21->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    if (bVar11) {
      __position._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (lVar33 + (long)ccouts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      while (__position._M_current !=
             ccouts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar4 = (local_440->super_cmCommonTargetGenerator).GeneratorTarget;
        pcVar22 = cmMakefile::GetOrCreateGeneratedSource
                            ((local_440->super_cmCommonTargetGenerator).Makefile,
                             __position._M_current);
        pcVar23 = cmGeneratorTarget::GetFileSetForSource(pcVar4,config,pcVar22);
        if (pcVar23 == (cmFileSet *)0x0) {
LAB_003668af:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&ccouts_private,__position._M_current);
LAB_003668bf:
          __position = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::erase(&ccouts,__position._M_current);
        }
        else {
          bVar12 = cmFileSetVisibilityIsForInterface(pcVar23->Visibility);
          bVar13 = cmFileSetTypeCanBeIncluded(&pcVar23->Type);
          if ((pcVar23 == (cmFileSet *)0x0) || (!bVar12 || !bVar13)) {
            if (pcVar23 == (cmFileSet *)0x0 || bVar13) goto LAB_003668af;
            goto LAB_003668bf;
          }
          __position._M_current = __position._M_current + 1;
        }
      }
    }
    cmCustomCommandGenerator::~cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)&customCommandSources);
  }
  psVar17 = config;
  cmLocalNinjaGenerator::AppendTargetDepends
            (local_440->LocalGenerator,(local_440->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_160,config,local_438,DependOnTargetOrdering);
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_430,config);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_160,&pmVar18->ExtraFiles);
  pbVar7 = ccouts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar6 = ccouts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  MVar24.GG = GetGlobalGenerator(pcVar32);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )pbVar7,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_160,MVar24);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_160,local_158._M_current);
  _Var25 = std::
           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (local_160,local_158._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_160,(const_iterator)_Var25._M_current,local_158);
  if (local_160 == local_158._M_current) {
    customCommandSources.
    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&customCommandSources.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    customCommandSources.
    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    customCommandSources.
    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)customCommandSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    pcVar19 = GetGlobalGenerator(pcVar32);
    bVar11 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar19);
    if (bVar11) {
      std::__cxx11::string::assign((char *)&customCommandSources);
    }
    else {
      psVar26 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)pcVar32->LocalGenerator);
      local_441 = '/';
      (*(pcVar32->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[0x10])
                (&sf,pcVar32->LocalGenerator,
                 (pcVar32->super_cmCommonTargetGenerator).GeneratorTarget);
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
                ((string *)&swiftSources,psVar26,&local_441,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf);
      std::__cxx11::string::operator=((string *)&customCommandSources,(string *)&swiftSources);
      std::__cxx11::string::~string((string *)&swiftSources);
      std::__cxx11::string::~string((string *)&sf);
    }
    psVar26 = ConvertToNinjaPath(pcVar32,(string *)&customCommandSources);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_160,psVar26);
    std::__cxx11::string::~string((string *)&customCommandSources);
  }
  pcVar19 = GetGlobalGenerator(pcVar32);
  pcVar15 = GetImplFileStream(pcVar32,local_438);
  cmGlobalNinjaGenerator::WriteBuild(pcVar19,(ostream *)pcVar15,(cmNinjaBuild *)&cc,0,(bool *)0x0);
  pcVar32->HasPrivateGeneratedSources =
       ccouts_private.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       ccouts_private.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (ccouts_private.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      ccouts_private.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"phony",(allocator<char> *)&swiftSources);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&customCommandSources,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    OrderDependsTargetForTarget((string *)&swiftSources,pcVar32,config);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&swiftSources);
    std::__cxx11::string::~string((string *)&swiftSources);
    OrderDependsTargetForTargetPrivate((string *)&swiftSources,pcVar32,config);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&swiftSources);
    std::__cxx11::string::~string((string *)&swiftSources);
    pbVar7 = ccouts_private.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar6 = ccouts_private.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    MVar24.GG = GetGlobalGenerator(pcVar32);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )pbVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2c0,MVar24);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_2c0,local_2b8._M_current);
    _Var25 = std::
             __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (local_2c0,local_2b8._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c0,(const_iterator)_Var25._M_current,local_2b8);
    pcVar19 = GetGlobalGenerator(pcVar32);
    pcVar15 = GetImplFileStream(pcVar32,local_438);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar19,(ostream *)pcVar15,(cmNinjaBuild *)&customCommandSources,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&customCommandSources);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ccouts_private);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ccouts);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&cc);
  cc = (cmCustomCommand *)0x0;
  pcStack_210 = (cmCustomCommand *)0x0;
  local_208._M_allocated_capacity = 0;
  cmGeneratorTarget::GetObjectSources
            ((pcVar32->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc,config);
  pcVar3 = pcStack_210;
  swiftSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  swiftSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  swiftSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar31 = cc;
  do {
    pcVar32 = local_440;
    if (pcVar31 == pcVar3) {
      psVar26 = psVar17;
      WriteSwiftObjectBuildStatement(local_440,&swiftSources,psVar17,local_438,firstForConfig);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&swiftSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc);
      customCommandSources.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      customCommandSources.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      customCommandSources.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetCxxModuleSources
                ((pcVar32->super_cmCommonTargetGenerator).GeneratorTarget,&customCommandSources,
                 psVar17);
      ppcVar9 = customCommandSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar34 = customCommandSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar34 != ppcVar9;
          ppcVar34 = ppcVar34 + 1) {
        WriteCxxModuleBmiBuildStatement(pcVar32,*ppcVar34,psVar26,local_438,firstForConfig);
      }
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&customCommandSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      cc = (cmCustomCommand *)0x0;
      pcStack_210 = (cmCustomCommand *)0x0;
      local_208._M_allocated_capacity = 0;
      cmGeneratorTarget::GetSourceFiles
                ((pcVar32->super_cmCommonTargetGenerator).GeneratorTarget,
                 (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cc,psVar26);
      pcVar3 = pcStack_210;
      for (pcVar31 = cc; pcVar31 != pcVar3;
          pcVar31 = (cmCustomCommand *)
                    &(pcVar31->Outputs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar22 = (cmSourceFile *)
                  (pcVar31->Outputs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar23 = cmGeneratorTarget::GetFileSetForSource
                            ((pcVar32->super_cmCommonTargetGenerator).GeneratorTarget,psVar26,
                             pcVar22);
        if ((pcVar23 != (cmFileSet *)0x0) &&
           (__y._M_str = "CXX_MODULES", __y._M_len = 0xb,
           __x_00._M_str = (pcVar23->Type)._M_dataplus._M_p,
           __x_00._M_len = (pcVar23->Type)._M_string_length, bVar11 = std::operator!=(__x_00,__y),
           !bVar11)) {
          cmSourceFile::GetLanguage_abi_cxx11_((string *)&customCommandSources,pcVar22);
          ppcVar9 = customCommandSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::~string((string *)&customCommandSources);
          if (ppcVar9 == (pointer)0x0) {
            pcVar4 = (local_440->super_cmCommonTargetGenerator).GeneratorTarget;
            pcVar2 = pcVar4->Makefile;
            psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
            psVar27 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar22);
            cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[21],std::__cxx11::string_const&,char_const(&)[75]>
                      ((string *)&customCommandSources,(char (*) [9])0x6c5c07,psVar17,
                       (char (*) [21])"\" has source file\n  ",psVar27,
                       (char (*) [75])
                       "\nin a \"FILE_SET TYPE CXX_MODULES\" but it is not scheduled for compilation."
                      );
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&customCommandSources);
            std::__cxx11::string::~string((string *)&customCommandSources);
          }
        }
        pcVar32 = local_440;
      }
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cc);
      bVar11 = cmGeneratorTarget::HaveFortranSources
                         ((pcVar32->super_cmCommonTargetGenerator).GeneratorTarget,psVar26);
      if (bVar11) {
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                  ::operator[](local_430,psVar26);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&customCommandSources,"Fortran",(allocator<char> *)&cc);
        sVar28 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
                 ::count(&pmVar18->ScanningInfo,(key_type *)&customCommandSources);
        std::__cxx11::string::~string((string *)&customCommandSources);
        if (sVar28 == 0) {
          customCommandSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&customCommandSources.
                         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          customCommandSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          customCommandSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)customCommandSources.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          pmVar18 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                    ::operator[](local_430,psVar26);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cc,"Fortran",(allocator<char> *)&swiftSources);
          this_00 = (vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
                       ::operator[](&pmVar18->ScanningInfo,(key_type *)&cc);
          std::
          vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
          ::emplace_back<cmNinjaTargetGenerator::ScanningFiles&>
                    (this_00,(ScanningFiles *)&customCommandSources);
          std::__cxx11::string::~string((string *)&cc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cc,"Fortran",(allocator<char> *)&swiftSources);
          WriteCompileRule(pcVar32,(string *)&cc,psVar26,Yes);
          std::__cxx11::string::~string((string *)&cc);
          ScanningFiles::~ScanningFiles((ScanningFiles *)&customCommandSources);
        }
      }
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                ::operator[](local_430,psVar26);
      for (p_Var29 = (pmVar18->ScanningInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var29 != &(pmVar18->ScanningInfo)._M_t._M_impl.super__Rb_tree_header;
          p_Var29 = (_Base_ptr)std::_Rb_tree_increment(p_Var29)) {
        lang = p_Var29 + 1;
        psVar17 = psVar26;
        LanguageDyndepRule(&local_b0,pcVar32,(string *)lang,psVar26);
        cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&customCommandSources,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        GetDyndepFilePath((string *)&cc,pcVar32,(string *)lang,psVar26);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc);
        std::__cxx11::string::~string((string *)&cc);
        psVar26 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                            ((pcVar32->super_cmCommonTargetGenerator).Makefile);
        ccouts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(ccouts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2f);
        (*(pcVar32->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
          super_cmOutputConverter._vptr_cmOutputConverter[0x10])
                  ((string *)&swiftSources,pcVar32->LocalGenerator,
                   (pcVar32->super_cmCommonTargetGenerator).GeneratorTarget);
        pcVar19 = GetGlobalGenerator(pcVar32);
        (*(pcVar19->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x4d])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,pcVar19,
                  psVar17);
        ccouts_private.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(ccouts_private.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2f);
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[13]>
                  ((string *)&cc,psVar26,(char *)&ccouts,(string *)&swiftSources,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                   (char *)&ccouts_private,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lang,
                   (char (*) [13])"Modules.json");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc);
        pcVar32 = local_440;
        psVar27 = psVar17;
        std::__cxx11::string::~string((string *)&cc);
        std::__cxx11::string::~string((string *)&sf);
        std::__cxx11::string::~string((string *)&swiftSources);
        GetTargetDependInfoPath((string *)&cc,pcVar32,(string *)lang,psVar17);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc);
        std::__cxx11::string::~string((string *)&cc);
        p_Var5 = p_Var29[2]._M_parent;
        for (__x = (value_type *)(*(long *)(p_Var29 + 2) + 0x20); pcVar32 = local_440,
            (_Base_ptr)(__x + -1) != p_Var5; __x = __x + 2) {
          if (__x[-1]._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_2f0,__x + -1);
          }
          if (__x->_M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_320,__x);
          }
        }
        psVar26 = psVar27;
        WriteTargetDependInfo(local_440,(string *)lang,psVar27);
        cmCommonTargetGenerator::GetLinkedTargetDirectories
                  ((LinkedTargetDirs *)&cc,&pcVar32->super_cmCommonTargetGenerator,(string *)lang,
                   psVar27);
        pcVar3 = pcStack_210;
        for (pcVar31 = cc; _Var10._M_p = local_1f8._M_p, uVar35 = local_208._8_8_, pcVar31 != pcVar3
            ; pcVar31 = (cmCustomCommand *)
                        &(pcVar31->Byproducts).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
          sf = (cmSourceFile *)CONCAT71(sf._1_7_,0x2f);
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
                    ((string *)&swiftSources,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar31,
                     (char *)&sf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lang,
                     (char (*) [13])"Modules.json");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_2d8,(string *)&swiftSources);
          std::__cxx11::string::~string((string *)&swiftSources);
        }
        for (; pcVar32 = local_440, (pointer)uVar35 != _Var10._M_p;
            uVar35 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar35 + 0x20)) {
          sf = (cmSourceFile *)CONCAT71(sf._1_7_,0x2f);
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
                    ((string *)&swiftSources,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar35,
                     (char *)&sf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lang,
                     (char (*) [13])"Modules.json");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_2d8,(string *)&swiftSources);
          std::__cxx11::string::~string((string *)&swiftSources);
        }
        pcVar19 = GetGlobalGenerator(local_440);
        pcVar15 = GetImplFileStream(pcVar32,local_438);
        cmGlobalNinjaGenerator::WriteBuild
                  (pcVar19,(ostream *)pcVar15,(cmNinjaBuild *)&customCommandSources,0,(bool *)0x0);
        cmCommonTargetGenerator::LinkedTargetDirs::~LinkedTargetDirs((LinkedTargetDirs *)&cc);
        cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&customCommandSources);
      }
      pcVar15 = GetImplFileStream(pcVar32,local_438);
      std::operator<<((ostream *)pcVar15,"\n");
      std::_Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::
      ~_Vector_base(&customCommands.
                     super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                   );
      return;
    }
    sf = (cmSourceFile *)
         (pcVar31->Outputs).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    bVar11 = cmLocalGenerator::IsSplitSwiftBuild((cmLocalGenerator *)local_440->LocalGenerator);
    if (bVar11) {
      cmSourceFile::GetLanguage_abi_cxx11_((string *)&customCommandSources,sf);
      bVar11 = std::operator==((string *)&customCommandSources,"Swift");
      std::__cxx11::string::~string((string *)&customCommandSources);
      if (!bVar11) goto LAB_00366d0a;
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
                (&swiftSources,&sf);
    }
    else {
LAB_00366d0a:
      WriteObjectBuildStatement(local_440,sf,psVar17,local_438,firstForConfig);
    }
    pcVar31 = (cmCustomCommand *)
              &(pcVar31->Outputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements(
  const std::string& config, const std::string& fileConfig,
  bool firstForConfig)
{
  this->GeneratorTarget->CheckCxxModuleStatus(config);

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetImplFileStream(fileConfig));
  this->GetImplFileStream(fileConfig)
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  std::vector<cmCustomCommand const*> customCommands;
  {
    std::vector<cmSourceFile const*> customCommandSources;
    this->GeneratorTarget->GetCustomCommands(customCommandSources, config);
    for (cmSourceFile const* sf : customCommandSources) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      customCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");

    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      auto objectFileName = this->GetGlobalGenerator()->ExpandCFGIntDir(
        this->ConvertToNinjaPath(sf->GetFullPath()), config);
      if (!cmHasSuffix(objectFileName, pchExtension)) {
        this->Configs[config].Objects.push_back(objectFileName);
      }
    }
  }

  if (!this->GetGlobalGenerator()->SupportsCWDDepend()) {
    // Ensure that the object directory exists. If there are no objects in the
    // target (e.g., an empty `OBJECT` library), the directory is still listed
    // as an order-only depends in the build files. Alternate `ninja`
    // implementations may not allow this (such as `samu`). See #25526.
    auto const objectDir = this->GetObjectFileDir(config);
    this->EnsureDirectoryExists(objectDir);
  }

  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Order-only phony target for ", this->GetTargetName());
    build.Outputs.push_back(this->OrderDependsTargetForTarget(config));

    // Gather order-only dependencies on custom command outputs.
    std::vector<std::string> ccouts;
    std::vector<std::string> ccouts_private;
    bool usePrivateGeneratedSources = false;
    if (this->GeneratorTarget->Target->HasFileSets()) {
      switch (this->GetGeneratorTarget()->GetPolicyStatusCMP0154()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::NEW:
          usePrivateGeneratedSources = true;
          break;
      }
    }
    for (cmCustomCommand const* cc : customCommands) {
      cmCustomCommandGenerator ccg(*cc, config, this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      auto const nPreviousOutputs = ccouts.size();
      ccouts.insert(ccouts.end(), ccoutputs.begin(), ccoutputs.end());
      ccouts.insert(ccouts.end(), ccbyproducts.begin(), ccbyproducts.end());
      if (usePrivateGeneratedSources) {
        auto it = ccouts.begin();
        // Skip over outputs that were already detected.
        std::advance(it, nPreviousOutputs);
        while (it != ccouts.end()) {
          cmFileSet const* fileset =
            this->GeneratorTarget->GetFileSetForSource(
              config, this->Makefile->GetOrCreateGeneratedSource(*it));
          bool isVisible = fileset &&
            cmFileSetVisibilityIsForInterface(fileset->GetVisibility());
          bool isIncludeable =
            !fileset || cmFileSetTypeCanBeIncluded(fileset->GetType());
          if (fileset && isVisible && isIncludeable) {
            ++it;
            continue;
          }
          if (!fileset || isIncludeable) {
            ccouts_private.push_back(*it);
          }
          it = ccouts.erase(it);
        }
      }
    }

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, config, fileConfig,
      DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cm::append(orderOnlyDeps, this->Configs[config].ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    std::transform(ccouts.begin(), ccouts.end(),
                   std::back_inserter(orderOnlyDeps), this->MapToNinjaPath());

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      std::string tgtDir;
      if (this->GetGlobalGenerator()->SupportsCWDDepend()) {
        tgtDir = ".";
      } else {
        // Any path that always exists will work here.
        tgtDir = cmStrCat(
          this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
          this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
      }
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);

    // Add order-only dependencies on custom command outputs that are
    // private to this target.
    this->HasPrivateGeneratedSources = !ccouts_private.empty();
    if (this->HasPrivateGeneratedSources) {
      cmNinjaBuild buildPrivate("phony");
      cmNinjaDeps& orderOnlyDepsPrivate = buildPrivate.OrderOnlyDeps;
      orderOnlyDepsPrivate.push_back(
        this->OrderDependsTargetForTarget(config));

      buildPrivate.Outputs.push_back(
        this->OrderDependsTargetForTargetPrivate(config));

      std::transform(ccouts_private.begin(), ccouts_private.end(),
                     std::back_inserter(orderOnlyDepsPrivate),
                     this->MapToNinjaPath());

      std::sort(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end());
      orderOnlyDepsPrivate.erase(
        std::unique(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end()),
        orderOnlyDepsPrivate.end());

      this->GetGlobalGenerator()->WriteBuild(
        this->GetImplFileStream(fileConfig), buildPrivate);
    }
  }
  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);

    std::vector<cmSourceFile const*> swiftSources;

    for (cmSourceFile const* sf : objectSources) {
      if (this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          sf->GetLanguage() == "Swift") {
        swiftSources.push_back(sf);
      } else {
        this->WriteObjectBuildStatement(sf, config, fileConfig,
                                        firstForConfig);
      }
    }
    WriteSwiftObjectBuildStatement(swiftSources, config, fileConfig,
                                   firstForConfig);
  }

  {
    std::vector<cmSourceFile const*> bmiOnlySources;
    this->GeneratorTarget->GetCxxModuleSources(bmiOnlySources, config);

    for (cmSourceFile const* sf : bmiOnlySources) {
      this->WriteCxxModuleBmiBuildStatement(sf, config, fileConfig,
                                            firstForConfig);
    }
  }

  // Detect sources in `CXX_MODULES` which are not compiled.
  {
    std::vector<cmSourceFile*> sources;
    this->GeneratorTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* sf : sources) {
      cmFileSet const* fs =
        this->GeneratorTarget->GetFileSetForSource(config, sf);
      if (!fs) {
        continue;
      }
      if (fs->GetType() != "CXX_MODULES"_s) {
        continue;
      }
      if (sf->GetLanguage().empty()) {
        this->GeneratorTarget->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Target \"", this->GeneratorTarget->GetName(),
                   "\" has source file\n  ", sf->GetFullPath(),
                   "\nin a \"FILE_SET TYPE CXX_MODULES\" but it is not "
                   "scheduled for compilation."));
      }
    }
  }

  // Check if there are Fortran objects which need to participate in forwarding
  // module requirements.
  if (this->GeneratorTarget->HaveFortranSources(config) &&
      !this->Configs[config].ScanningInfo.count("Fortran")) {
    ScanningFiles files;
    this->Configs[config].ScanningInfo["Fortran"].emplace_back(files);
    this->WriteCompileRule("Fortran", config, WithScanning::Yes);
  }

  for (auto const& langScanningFiles : this->Configs[config].ScanningInfo) {
    std::string const& language = langScanningFiles.first;
    std::vector<ScanningFiles> const& scanningFiles = langScanningFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language, config));
    build.Outputs.push_back(this->GetDyndepFilePath(language, config));
    build.ImplicitOuts.emplace_back(
      cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               this->GetGlobalGenerator()->ConfigDirectory(config), '/',
               language, "Modules.json"));
    build.ImplicitDeps.emplace_back(
      this->GetTargetDependInfoPath(language, config));
    for (auto const& scanFiles : scanningFiles) {
      if (!scanFiles.ScanningOutput.empty()) {
        build.ExplicitDeps.push_back(scanFiles.ScanningOutput);
      }
      if (!scanFiles.ModuleMapFile.empty()) {
        build.ImplicitOuts.push_back(scanFiles.ModuleMapFile);
      }
    }

    this->WriteTargetDependInfo(language, config);

    auto const linked_directories =
      this->GetLinkedTargetDirectories(language, config);
    for (std::string const& l : linked_directories.Direct) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }
    for (std::string const& l : linked_directories.Forward) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  this->GetImplFileStream(fileConfig) << "\n";
}